

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

string * __thiscall
SchemePair::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemePair *this)

{
  _Base_ptr *pp_Var1;
  element_type *peVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  SchemePair *pSVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base **pp_Var9;
  SchemePair *pSVar10;
  _Rb_tree_node_base *p_Var11;
  size_type *psVar12;
  char *pcVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined1 auVar15 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  initializer_list<const_SchemePair_*> __l;
  string res;
  shared_ptr<SchemeObject> p;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  SchemePair *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Base_ptr *local_b8;
  long local_b0;
  _Rb_tree_node_base *local_a8;
  long lStack_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [8];
  _Rb_tree_node_base local_80;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_50;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40 [2];
  
  peVar2 = (this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"()","");
    return __return_storage_ptr__;
  }
  p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar4 = __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemeSymbol::typeinfo,0);
  lVar5 = 0;
  if ((lVar4 != 0) &&
     (p_Var16 = (this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi, lVar5 = lVar4,
     p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
    }
  }
  local_c0 = p_Var16;
  if (lVar5 == 0) goto LAB_001300c9;
  pp_Var1 = &local_80._M_parent;
  local_88 = (undefined1  [8])pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  pcVar13 = (char *)(lVar5 + 8);
  iVar3 = std::__cxx11::string::compare(pcVar13);
  if (iVar3 == 0) {
    pcVar13 = "\'";
LAB_00130017:
    std::__cxx11::string::_M_replace((ulong)local_88,0,(char *)local_80._0_8_,(ulong)pcVar13);
  }
  else {
    iVar3 = std::__cxx11::string::compare(pcVar13);
    if (iVar3 == 0) {
      pcVar13 = "`";
      goto LAB_00130017;
    }
    iVar3 = std::__cxx11::string::compare(pcVar13);
    if (iVar3 == 0) {
      pcVar13 = ",";
      goto LAB_00130017;
    }
    iVar3 = std::__cxx11::string::compare(pcVar13);
    if (iVar3 == 0) {
      std::__cxx11::string::operator=((string *)local_88,",@");
    }
  }
  if ((char *)local_80._0_8_ != (char *)0x0) {
    peVar2 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(peVar2,&SchemeObject::typeinfo,&typeinfo,0);
    }
    if (lVar5 == 0) {
      lVar5 = 0;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var14 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
    }
    if ((lVar5 != 0) &&
       (*(element_type **)(lVar5 + 0x18) ==
        scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
      (**(code **)(**(long **)(lVar5 + 8) + 0x10))(&local_b8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_88)
      ;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        lVar5 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,(ulong)((long)&local_a8->_M_color + 1));
      }
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      auVar15 = local_88;
      if (local_88 == (undefined1  [8])pp_Var1) goto LAB_0013064a;
      goto LAB_00130642;
    }
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
  }
  if (local_88 != (undefined1  [8])pp_Var1) {
    operator_delete((void *)local_88,(ulong)((long)&(local_80._M_parent)->_M_color + 1));
  }
LAB_001300c9:
  (*((this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_SchemeObject[2])(local_88);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x15a765);
  local_b8 = &local_a8;
  pp_Var9 = (_Rb_tree_node_base **)(plVar6 + 2);
  if ((_Base_ptr *)*plVar6 == pp_Var9) {
    local_a8 = *pp_Var9;
    lStack_a0 = plVar6[3];
  }
  else {
    local_a8 = *pp_Var9;
    local_b8 = (_Base_ptr *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)pp_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_88 != (undefined1  [8])&local_80._M_parent) {
    operator_delete((void *)local_88,(ulong)((long)&(local_80._M_parent)->_M_color + 1));
  }
  local_98 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90._M_pi =
       (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_100;
  local_100 = this;
  local_58 = __return_storage_ptr__;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )local_88,__l,(less<const_SchemePair_*> *)&local_e0,(allocator_type *)&local_50);
  p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    if (local_98 == (element_type *)0x0) {
      pSVar7 = (SchemePair *)0x0;
    }
    else {
      pSVar7 = (SchemePair *)__dynamic_cast(local_98,&SchemeObject::typeinfo,&typeinfo,0);
    }
    if (pSVar7 == (SchemePair *)0x0) {
      pSVar7 = (SchemePair *)0x0;
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00._M_pi = local_90._M_pi;
      if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
        }
      }
    }
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    __return_storage_ptr__ = local_58;
    if (pSVar7 == (SchemePair *)0x0) {
      local_e0._M_pi = &local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_b8,local_b0 + (long)local_b8);
      std::__cxx11::string::append((char *)&local_e0);
      __return_storage_ptr__ = local_58;
      (*local_98->_vptr_SchemeObject[2])(&local_50);
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&local_d8->_vptr_SchemeObject + local_48);
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if (local_e0._M_pi != &local_d0) {
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._vptr__Sp_counted_base;
      }
      if (p_Var14 < p_Var16) {
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_50 != local_40) {
          p_Var14 = local_40[0];
        }
        if (p_Var14 < p_Var16) goto LAB_0013041a;
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,(ulong)local_e0._M_pi);
      }
      else {
LAB_0013041a:
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_50);
      }
      pSVar7 = (SchemePair *)(plVar6 + 2);
      if ((SchemePair *)*plVar6 == pSVar7) {
        local_f0._0_8_ = (pSVar7->super_SchemeObject)._vptr_SchemeObject;
        local_f0._8_8_ = plVar6[3];
        local_100 = (SchemePair *)local_f0;
      }
      else {
        local_f0._0_8_ = (pSVar7->super_SchemeObject)._vptr_SchemeObject;
        local_100 = (SchemePair *)*plVar6;
      }
      local_f8 = plVar6[1];
      *plVar6 = (long)pSVar7;
      plVar6[1] = 0;
      *(undefined1 *)&(pSVar7->super_SchemeObject)._vptr_SchemeObject = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        lVar5 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_100 != (SchemePair *)local_f0) {
        operator_delete(local_100,local_f0._0_8_ + 1);
      }
      p_Var16 = local_c0;
      if (local_50 != local_40) {
        operator_delete(local_50,(ulong)((long)&local_40[0]->_vptr__Sp_counted_base + 1));
      }
      if (local_e0._M_pi != &local_d0) {
        operator_delete(local_e0._M_pi,
                        (ulong)((long)(_func_int ***)local_d0._vptr__Sp_counted_base + 1));
      }
      goto LAB_00130605;
    }
    if (local_98 == scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    {
      (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_b8,local_b0 + (long)local_b8);
      p_Var16 = local_c0;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00130605;
    }
    (*((pSVar7->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_SchemeObject[2])(&local_e0);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x15517c);
    pSVar10 = (SchemePair *)(plVar6 + 2);
    if ((SchemePair *)*plVar6 == pSVar10) {
      local_f0._0_8_ = (pSVar10->super_SchemeObject)._vptr_SchemeObject;
      local_f0._8_8_ = plVar6[3];
      local_100 = (SchemePair *)local_f0;
    }
    else {
      local_f0._0_8_ = (pSVar10->super_SchemeObject)._vptr_SchemeObject;
      local_100 = (SchemePair *)*plVar6;
    }
    local_f8 = plVar6[1];
    *plVar6 = (long)pSVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_100);
    if (local_100 != (SchemePair *)local_f0) {
      operator_delete(local_100,local_f0._0_8_ + 1);
    }
    p_Var8 = &local_80;
    p_Var11 = local_80._M_parent;
    if (local_e0._M_pi != &local_d0) {
      operator_delete(local_e0._M_pi,
                      (ulong)((long)(_func_int ***)local_d0._vptr__Sp_counted_base + 1));
      p_Var11 = local_80._M_parent;
    }
    for (; __return_storage_ptr__ = local_58, p_Var11 != (_Rb_tree_node_base *)0x0;
        p_Var11 = (&p_Var11->_M_left)[*(SchemePair **)(p_Var11 + 1) < pSVar7]) {
      if (*(SchemePair **)(p_Var11 + 1) >= pSVar7) {
        p_Var8 = p_Var11;
      }
    }
    p_Var11 = &local_80;
    if ((p_Var8 != &local_80) && (p_Var11 = p_Var8, pSVar7 < *(SchemePair **)(p_Var8 + 1))) {
      p_Var11 = &local_80;
    }
    if (p_Var11 != &local_80) break;
    local_98 = (pSVar7->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_90,
               &(pSVar7->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_100 = pSVar7;
    std::
    _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
    ::_M_insert_unique<SchemePair_const*>
              ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                *)local_88,&local_100);
    p_Var16 = this_00._M_pi;
  } while( true );
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_b8,local_b0 + (long)local_b8);
  p_Var16 = local_c0;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00130605:
  std::
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  ::~_Rb_tree((_Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
               *)local_88);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  local_80._M_parent = local_a8;
  auVar15 = (undefined1  [8])local_b8;
  if (local_b8 == &local_a8) goto LAB_0013064a;
LAB_00130642:
  operator_delete((void *)auVar15,(ulong)((long)&(local_80._M_parent)->_M_color + 1));
LAB_0013064a:
  if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SchemePair::external_repr() const
{
    if(!car)
        return "()";
    auto pcar = std::dynamic_pointer_cast<SchemeSymbol>(car);
    if(pcar)
    {
        std::string prefix = "";
        if(pcar->value == "quote")
            prefix = "'";
        else if(pcar->value == "quasiquote")
            prefix = "`";
        else if(pcar->value == "unquote")
            prefix = ",";
        else if(pcar->value == "unquote-splicing")
            prefix = ",@";
        if(prefix.length())
        {
            auto pcdr = std::dynamic_pointer_cast<SchemePair>(cdr);
            if(pcdr && pcdr->cdr == scheme_nil)
                return prefix + pcdr->car->external_repr();
        }
    }
    std::string res = "(" + car->external_repr();
    std::shared_ptr<SchemeObject> p = cdr;
    std::shared_ptr<SchemePair> pp;
    std::set<const SchemePair *> visited{this};
    while((pp = std::dynamic_pointer_cast<SchemePair>(p)))
    {
        if(p == scheme_nil)
            return res + ")";
        res += " " + pp->car->external_repr();
        if(visited.count(pp.get()))
            return res + " ...)";
        p = pp->cdr;
        visited.insert(pp.get());
    }
    return res + " . " + p->external_repr() + ")";
}